

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_consts
          (t_cpp_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  string *__rhs;
  int *piVar1;
  t_type *ttype;
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar2;
  string *psVar3;
  ostream *poVar4;
  int __oflag;
  int __oflag_00;
  pointer pptVar5;
  int iVar6;
  string name;
  string f_consts_impl_name;
  string f_consts_name;
  ofstream_with_content_based_conditional_update f_consts_impl;
  ofstream_with_content_based_conditional_update f_consts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  vector<t_const_*,_std::allocator<t_const_*>_> *local_420;
  string *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_370;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1d0;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,this);
  __rhs = &(this->super_t_oop_generator).super_t_generator.program_name_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                 __rhs);
  std::operator+(&local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 "_constants.h");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_370);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1d0);
  if ((consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&local_1d0,(char *)&local_3f0,__oflag);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_440);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   &local_440,__rhs);
    std::operator+(&local_410,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_370,
                   "_constants.cpp");
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_440);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    template_ofstream_with_content_based_conditional_update(&local_370);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&local_370,(char *)&local_410,__oflag_00);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_440);
    std::operator<<((ostream *)&local_1d0,(string *)&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_440);
    std::operator<<((ostream *)&local_370,(string *)&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    poVar4 = std::operator<<((ostream *)&local_1d0,"#ifndef ");
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,"_CONSTANTS_H");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"#define ");
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,"_CONSTANTS_H");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"#include \"");
    get_include_prefix_abi_cxx11_
              (&local_440,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar4 = std::operator<<(poVar4,(string *)&local_440);
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,"_types.h\"");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&this->ns_open_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_440);
    poVar4 = std::operator<<((ostream *)&local_370,"#include \"");
    get_include_prefix_abi_cxx11_
              (&local_440,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar4 = std::operator<<(poVar4,(string *)&local_440);
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,"_constants.h\"");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&this->ns_open_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_440);
    poVar4 = std::operator<<((ostream *)&local_1d0,"class ");
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,"Constants {");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4," public:");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)__rhs);
    poVar4 = std::operator<<(poVar4,"Constants();");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    local_420 = consts;
    local_418 = (string *)__rhs;
    for (pptVar5 = (consts->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar5 !=
        (local_420->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      std::__cxx11::string::string((string *)&local_440,(string *)&(*pptVar5)->name_);
      ttype = (*pptVar5)->type_;
      t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)&local_1d0,(string *)&local_390);
      type_name_abi_cxx11_(&local_3b0,this,ttype,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)&local_440);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_440);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = std::operator<<((ostream *)&local_1d0,"};");
    psVar3 = local_418;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<((ostream *)&local_370,"const ");
    poVar4 = std::operator<<(poVar4,psVar3);
    poVar4 = std::operator<<(poVar4,"Constants g_");
    poVar4 = std::operator<<(poVar4,psVar3);
    poVar4 = std::operator<<(poVar4,"_constants;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,psVar3);
    poVar4 = std::operator<<(poVar4,"Constants::");
    poVar4 = std::operator<<(poVar4,psVar3);
    poVar4 = std::operator<<(poVar4,"Constants() {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    pvVar2 = local_420;
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar5 = (local_420->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar5 !=
        (pvVar2->super__Vector_base<t_const_*,_std::allocator<t_const_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      std::__cxx11::string::string((string *)&local_3d0,(string *)&(*pptVar5)->name_);
      print_const_value(this,(ostream *)&local_370,&local_3d0,(*pptVar5)->type_,(*pptVar5)->value_);
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&local_370);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<((ostream *)&local_1d0,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"extern const ");
    poVar4 = std::operator<<(poVar4,psVar3);
    poVar4 = std::operator<<(poVar4,"Constants g_");
    poVar4 = std::operator<<(poVar4,psVar3);
    poVar4 = std::operator<<(poVar4,"_constants;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&this->ns_close_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"#endif");
    iVar6 = 0x36bba0;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&local_1d0,iVar6);
    poVar4 = std::operator<<((ostream *)&local_370,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,(string *)&this->ns_close_);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    iVar6 = 0x36bba0;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&local_370,iVar6);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    ~template_ofstream_with_content_based_conditional_update(&local_370);
    std::__cxx11::string::~string((string *)&local_410);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  return;
}

Assistant:

void t_cpp_generator::generate_consts(std::vector<t_const*> consts) {
  string f_consts_name = get_out_dir() + program_name_ + "_constants.h";
  ofstream_with_content_based_conditional_update f_consts;
  if (consts.size() > 0) {
    f_consts.open(f_consts_name);

    string f_consts_impl_name = get_out_dir() + program_name_ + "_constants.cpp";
    ofstream_with_content_based_conditional_update f_consts_impl;
    f_consts_impl.open(f_consts_impl_name);

    // Print header
    f_consts << autogen_comment();
    f_consts_impl << autogen_comment();

    // Start ifndef
    f_consts << "#ifndef " << program_name_ << "_CONSTANTS_H" << endl << "#define " << program_name_
             << "_CONSTANTS_H" << endl << endl << "#include \"" << get_include_prefix(*get_program())
             << program_name_ << "_types.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts_impl << "#include \"" << get_include_prefix(*get_program()) << program_name_
                  << "_constants.h\"" << endl << endl << ns_open_ << endl << endl;

    f_consts << "class " << program_name_ << "Constants {" << endl << " public:" << endl << "  "
             << program_name_ << "Constants();" << endl << endl;
    indent_up();
    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      string name = (*c_iter)->get_name();
      t_type* type = (*c_iter)->get_type();
      f_consts << indent() << type_name(type) << " " << name << ";" << endl;
    }
    indent_down();
    f_consts << "};" << endl;

    f_consts_impl << "const " << program_name_ << "Constants g_" << program_name_ << "_constants;"
                  << endl << endl << program_name_ << "Constants::" << program_name_
                  << "Constants() {" << endl;
    indent_up();
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      print_const_value(f_consts_impl,
                        (*c_iter)->get_name(),
                        (*c_iter)->get_type(),
                        (*c_iter)->get_value());
    }
    indent_down();
    indent(f_consts_impl) << "}" << endl;

    f_consts << endl << "extern const " << program_name_ << "Constants g_" << program_name_
             << "_constants;" << endl << endl << ns_close_ << endl << endl << "#endif" << endl;
    f_consts.close();

    f_consts_impl << endl << ns_close_ << endl << endl;
    f_consts_impl.close();
  }
}